

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

bool __thiscall OpenMD::RigidBody::getAtomVel(RigidBody *this,Vector3d *vel,Atom *atom)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  StuntDouble *in_RDX;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  *in_RSI;
  StuntDouble *in_RDI;
  iterator i;
  uint in_stack_000002bc;
  Vector3d *in_stack_000002c0;
  RigidBody *in_stack_000002c8;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  StuntDouble *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_28);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,OpenMD::Atom*>
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(Atom **)in_RDI);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffffa0,
                     (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (bVar1) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    __gnu_cxx::operator-
              (local_18,(__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_1 = getAtomVel(in_stack_000002c8,in_stack_000002c0,in_stack_000002bc);
  }
  else {
    uVar2 = StuntDouble::getGlobalIndex(local_20);
    uVar3 = StuntDouble::getGlobalIndex(in_RDI);
    snprintf(painCave.errMsg,2000,"Atom %d does not belong to rigid body %d.\n",(ulong)uVar2,
             (ulong)uVar3);
    painCave.isFatal = 0;
    simError();
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RigidBody::getAtomVel(Vector3d& vel, Atom* atom) {
    std::vector<Atom*>::iterator i;
    i = std::find(atoms_.begin(), atoms_.end(), atom);
    if (i != atoms_.end()) {
      return getAtomVel(vel, i - atoms_.begin());
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Atom %d does not belong to rigid body %d.\n",
               atom->getGlobalIndex(), getGlobalIndex());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }